

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O2

int test_all_device_options
              (TEST_PROTOCOL_TYPE protocol_type,IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client)

{
  IOTHUB_CLIENT_RESULT IVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int connection_timeout;
  undefined4 uStack_54;
  int keep_alive;
  undefined4 uStack_4c;
  _Bool url_encode;
  undefined7 uStack_47;
  size_t send_timeout;
  double remote_idle_timeout;
  tickcounter_ms_t msg_timeout;
  size_t sas_token_refresh;
  size_t refresh_sas_token;
  
  refresh_sas_token = 0x708;
  sas_token_refresh = 0x708;
  msg_timeout = 0x78;
  IVar1 = IoTHubDeviceClient_LL_SetOption(device_client,"sas_token_lifetime",&refresh_sas_token);
  if (IVar1 == IOTHUB_CLIENT_OK) {
    iVar4 = 0;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      iVar4 = 1;
    }
    else {
      iVar4 = 1;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                ,"test_all_device_options",0x187,1,
                "Failure setting option OPTION_SAS_TOKEN_LIFETIME");
    }
  }
  IVar1 = IoTHubDeviceClient_LL_SetOption(device_client,"sas_token_refresh_time",&sas_token_refresh)
  ;
  if (IVar1 != IOTHUB_CLIENT_OK) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                ,"test_all_device_options",0x18c,1,
                "Failure setting option OPTION_SAS_TOKEN_REFRESH_TIME");
    }
    iVar4 = iVar4 + 1;
  }
  IVar1 = IoTHubDeviceClient_LL_SetOption(device_client,"messageTimeout",&msg_timeout);
  if (IVar1 != IOTHUB_CLIENT_OK) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                ,"test_all_device_options",0x191,1,"Failure setting option OPTION_MESSAGE_TIMEOUT");
    }
    iVar4 = iVar4 + 1;
  }
  IVar1 = IoTHubDeviceClient_LL_SetOption(device_client,"product_info","custom_product_info");
  if (IVar1 != IOTHUB_CLIENT_OK) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                ,"test_all_device_options",0x196,1,"Failure setting option OPTION_PRODUCT_INFO");
    }
    iVar4 = iVar4 + 1;
  }
  if (protocol_type < TEST_AMQP) {
    _keep_alive = CONCAT44(uStack_4c,300);
    _connection_timeout = CONCAT44(uStack_54,0x1f);
    _url_encode = CONCAT71(uStack_47,1);
    IVar1 = IoTHubDeviceClient_LL_SetOption(device_client,"auto_url_encode_decode",&url_encode);
    if (IVar1 != IOTHUB_CLIENT_OK) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"test_all_device_options",0x1a3,1,
                  "Failure setting option OPTION_AUTO_URL_ENCODE_DECODE");
      }
      iVar4 = iVar4 + 1;
    }
    IVar1 = IoTHubDeviceClient_LL_SetOption(device_client,"keepalive",&keep_alive);
    if (IVar1 != IOTHUB_CLIENT_OK) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"test_all_device_options",0x1a8,1,"Failure setting option OPTION_KEEP_ALIVE");
      }
      iVar4 = iVar4 + 1;
    }
    IVar1 = IoTHubDeviceClient_LL_SetOption(device_client,"connect_timeout",&connection_timeout);
    if (IVar1 == IOTHUB_CLIENT_OK) {
      return iVar4;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0011bc46;
    pcVar5 = "Failure setting option OPTION_CONNECTION_TIMEOUT";
    iVar3 = 0x1ad;
  }
  else if ((protocol_type & ~TEST_MQTT_WEBSOCKETS) == TEST_AMQP) {
    _keep_alive = 0x23;
    _connection_timeout = 0xf1;
    _url_encode = 0xf1;
    remote_idle_timeout = 0.08;
    send_timeout = 0x12d;
    IVar1 = IoTHubDeviceClient_LL_SetOption(device_client,"cbs_request_timeout",&keep_alive);
    if (IVar1 != IOTHUB_CLIENT_OK) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"test_all_device_options",0x1bc,1,
                  "Failure setting option OPTION_CBS_REQUEST_TIMEOUT");
      }
      iVar4 = iVar4 + 1;
    }
    IVar1 = IoTHubDeviceClient_LL_SetOption
                      (device_client,"svc2cl_keep_alive_timeout_secs",&connection_timeout);
    if (IVar1 != IOTHUB_CLIENT_OK) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"test_all_device_options",0x1c1,1,
                  "Failure setting option OPTION_SERVICE_SIDE_KEEP_ALIVE_FREQ_SECS");
      }
      iVar4 = iVar4 + 1;
    }
    IVar1 = IoTHubDeviceClient_LL_SetOption(device_client,"c2d_keep_alive_freq_secs",&url_encode);
    if (IVar1 != IOTHUB_CLIENT_OK) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"test_all_device_options",0x1c6,1,
                  "Failure setting option OPTION_C2D_KEEP_ALIVE_FREQ_SECS");
      }
      iVar4 = iVar4 + 1;
    }
    IVar1 = IoTHubDeviceClient_LL_SetOption
                      (device_client,"cl2svc_keep_alive_send_ratio",&remote_idle_timeout);
    if (IVar1 != IOTHUB_CLIENT_OK) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"test_all_device_options",0x1cb,1,
                  "Failure setting option OPTION_REMOTE_IDLE_TIMEOUT_RATIO");
      }
      iVar4 = iVar4 + 1;
    }
    IVar1 = IoTHubDeviceClient_LL_SetOption(device_client,"event_send_timeout_secs",&send_timeout);
    if (IVar1 == IOTHUB_CLIENT_OK) {
      return iVar4;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0011bc46;
    pcVar5 = "Failure setting option OPTION_EVENT_SEND_TIMEOUT_SECS";
    iVar3 = 0x1d0;
  }
  else {
    if (protocol_type != TEST_HTTP) {
      return iVar4;
    }
    _keep_alive = CONCAT44(uStack_4c,0xfa);
    _connection_timeout = CONCAT71(stack0xffffffffffffffa9,1);
    IVar1 = IoTHubDeviceClient_LL_SetOption(device_client,"MinimumPollingTime",&keep_alive);
    if (IVar1 != IOTHUB_CLIENT_OK) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"test_all_device_options",0x1da,1,
                  "Failure setting option OPTION_MIN_POLLING_TIME");
      }
      iVar4 = iVar4 + 1;
    }
    IVar1 = IoTHubDeviceClient_LL_SetOption(device_client,"Batching",&connection_timeout);
    if (IVar1 == IOTHUB_CLIENT_OK) {
      return iVar4;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0011bc46;
    pcVar5 = "Failure setting option OPTION_BATCHING";
    iVar3 = 0x1df;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
            ,"test_all_device_options",iVar3,1,pcVar5);
LAB_0011bc46:
  return iVar4 + 1;
}

Assistant:

static int test_all_device_options(TEST_PROTOCOL_TYPE protocol_type, IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client)
{
    int result = 0;

    size_t refresh_sas_token = 30 * 60;
    size_t sas_token_refresh = 30 * 60;
    tickcounter_ms_t msg_timeout = 2*60;

    if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_SAS_TOKEN_LIFETIME, &refresh_sas_token)))
    {
        LogError("Failure setting option OPTION_SAS_TOKEN_LIFETIME");
        result++;
    }
    if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_SAS_TOKEN_REFRESH_TIME, &sas_token_refresh)))
    {
        LogError("Failure setting option OPTION_SAS_TOKEN_REFRESH_TIME");
        result++;
    }
    if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_MESSAGE_TIMEOUT, &msg_timeout)))
    {
        LogError("Failure setting option OPTION_MESSAGE_TIMEOUT");
        result++;
    }
    if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_PRODUCT_INFO, "custom_product_info")))
    {
        LogError("Failure setting option OPTION_PRODUCT_INFO");
        result++;
    }
    // Proxy host???

    // MQTT only
    if (protocol_type == TEST_MQTT || protocol_type == TEST_MQTT_WEBSOCKETS)
    {
        int keep_alive = 5 * 60;
        int connection_timeout = 31;
        bool url_encode = true;
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_AUTO_URL_ENCODE_DECODE, &url_encode)))
        {
            LogError("Failure setting option OPTION_AUTO_URL_ENCODE_DECODE");
            result++;
        }
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_KEEP_ALIVE, &keep_alive)))
        {
            LogError("Failure setting option OPTION_KEEP_ALIVE");
            result++;
        }
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_CONNECTION_TIMEOUT, &connection_timeout)))
        {
            LogError("Failure setting option OPTION_CONNECTION_TIMEOUT");
            result++;
        }
    }
    else if (protocol_type == TEST_AMQP || protocol_type == TEST_AMQP_WEBSOCKETS)
    {
        size_t cbs_refresh = 35;
        size_t server_side_keep_alive = 241;
        size_t c2d_side_keep_alive = 241;
        double remote_idle_timeout = .08;
        size_t send_timeout = 301;

        // Amqp only
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_CBS_REQUEST_TIMEOUT, &cbs_refresh)))
        {
            LogError("Failure setting option OPTION_CBS_REQUEST_TIMEOUT");
            result++;
        }
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_SERVICE_SIDE_KEEP_ALIVE_FREQ_SECS, &server_side_keep_alive)))
        {
            LogError("Failure setting option OPTION_SERVICE_SIDE_KEEP_ALIVE_FREQ_SECS");
            result++;
        }
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_C2D_KEEP_ALIVE_FREQ_SECS, &c2d_side_keep_alive)))
        {
            LogError("Failure setting option OPTION_C2D_KEEP_ALIVE_FREQ_SECS");
            result++;
        }
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_REMOTE_IDLE_TIMEOUT_RATIO, &remote_idle_timeout)))
        {
            LogError("Failure setting option OPTION_REMOTE_IDLE_TIMEOUT_RATIO");
            result++;
        }
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_EVENT_SEND_TIMEOUT_SECS, &send_timeout)))
        {
            LogError("Failure setting option OPTION_EVENT_SEND_TIMEOUT_SECS");
            result++;
        }
    }
    else if (protocol_type == TEST_HTTP)
    {
        unsigned int min_poll_time = 5 * 50;
        bool batching = true;
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_MIN_POLLING_TIME, &min_poll_time)))
        {
            LogError("Failure setting option OPTION_MIN_POLLING_TIME");
            result++;
        }
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetOption(device_client, OPTION_BATCHING, &batching)))
        {
            LogError("Failure setting option OPTION_BATCHING");
            result++;
        }
    }
    return result;
}